

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::openindexfiles(summarycalc *this)

{
  FILE *pFVar1;
  _Base_ptr p_Var2;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  x;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  
  for (p_Var2 = (this->indexFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->indexFiles)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_58,
           (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(p_Var2 + 1));
    pFVar1 = fopen(local_50._M_p,"w");
    this->idxout[(int)local_58._0_4_] = (FILE *)pFVar1;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void summarycalc::openindexfiles()
{
	for (auto x : indexFiles) {
		FILE *f = fopen(x.second.c_str(), "w");
		idxout[x.first] = f;
	}
}